

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
          (ConfidentialTransactionContext *this,ConfidentialTransactionContext *context)

{
  AbstractTransaction *in_RSI;
  ConfidentialTransaction *in_RDI;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_00000028;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_00000030;
  ConfidentialTransaction *pCVar1;
  pointer *this_00;
  string local_30;
  
  core::AbstractTransaction::GetHex_abi_cxx11_(&local_30,in_RSI);
  core::ConfidentialTransaction::ConfidentialTransaction(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (in_RDI->super_AbstractTransaction)._vptr_AbstractTransaction =
       (_func_int **)&PTR__ConfidentialTransactionContext_00b64080;
  pCVar1 = in_RDI + 1;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x57a8e3);
  this_00 = &in_RDI[1].vin_.
             super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::
  map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  ::map((map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
         *)0x57a8f6);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x57a90c);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x57a922);
  core::BlockHash::BlockHash((BlockHash *)0x57a938);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator=
            (in_stack_00000030,in_stack_00000028);
  std::
  map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  ::operator=((map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
               *)this_00,
              (map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
               *)pCVar1);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::operator=
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)in_stack_00000030,
             (vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)in_stack_00000028)
  ;
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::operator=
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)in_stack_00000030,
             (vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)in_stack_00000028)
  ;
  return;
}

Assistant:

ConfidentialTransactionContext::ConfidentialTransactionContext(
    const ConfidentialTransactionContext& context)
    : ConfidentialTransaction(context.GetHex()) {
  utxo_map_ = context.utxo_map_;
  signed_map_ = context.signed_map_;
  verify_map_ = context.verify_map_;
  verify_ignore_map_ = context.verify_ignore_map_;
}